

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          lexeme_t<cfgfile::string_trait_t> *lexeme,tag_t<cfgfile::string_trait_t> *tag)

{
  __type _Var1;
  lexeme_type_t lVar2;
  undefined8 uVar3;
  input_stream_t<cfgfile::string_trait_t> *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_t *file_name;
  parser_info_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_RDX;
  lexeme_t<cfgfile::string_trait_t> *in_RSI;
  long in_RDI;
  lexical_analyzer_t<cfgfile::string_trait_t> *this_01;
  string *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  string_t *in_stack_fffffffffffffa88;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  undefined1 local_4d0 [48];
  tag_t<cfgfile::string_trait_t> *local_4a0;
  undefined1 local_492;
  allocator local_491;
  string local_490 [103];
  allocator local_429;
  string local_428 [71];
  allocator local_3e1;
  string local_3e0 [198];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [103];
  allocator local_2b1;
  string local_2b0 [71];
  allocator local_269;
  string local_268 [198];
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [103];
  allocator local_139;
  string local_138 [87];
  allocator local_e1;
  string local_e0 [192];
  tag_t<cfgfile::string_trait_t> *local_20;
  lexeme_t<cfgfile::string_trait_t> *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar2 = lexeme_t<cfgfile::string_trait_t>::type(in_RSI);
  if (lVar2 == start) {
    local_1a2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,&local_e1);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                       ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
    std::operator+(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"\" on line ",&local_139);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    lexical_analyzer_t<cfgfile::string_trait_t>::line_number
              ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffa78);
    std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,".",&local_1a1);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    local_1a2 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  lVar2 = lexeme_t<cfgfile::string_trait_t>::type(local_18);
  if (lVar2 != finish) {
    lVar2 = lexeme_t<cfgfile::string_trait_t>::type(local_18);
    if (lVar2 != null) {
      tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_20);
      lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(local_18);
      _Var1 = std::operator==(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      if (_Var1) {
        local_4a0 = local_20;
        std::
        stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::push((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                *)in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
        this_01 = (lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60);
        piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream(this_01);
        file_name = input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
        this_00 = (parser_info_t<cfgfile::string_trait_t> *)
                  lexical_analyzer_t<cfgfile::string_trait_t>::line_number(this_01);
        lexical_analyzer_t<cfgfile::string_trait_t>::column_number(this_01);
        puVar5 = local_4d0;
        parser_info_t<cfgfile::string_trait_t>::parser_info_t
                  (this_00,file_name,(pos_t)this_01,(pos_t)in_stack_fffffffffffffa78);
        (*local_20->_vptr_tag_t[4])(local_20,puVar5);
        parser_info_t<cfgfile::string_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::string_trait_t> *)0x163348);
      }
      return _Var1;
    }
    local_492 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"Unexpected end of file. In file \"",&local_3e1);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                       ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
    std::operator+(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"\" on line ",&local_429);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                      ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffa78);
    std::operator+(__lhs,in_stack_fffffffffffffab0);
    __rhs = &local_491;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,".",__rhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffa78);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    local_492 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  local_31a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_268,
             "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
             ,&local_269);
  string_trait_t::from_ascii(in_stack_fffffffffffffa78);
  piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                     ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
  input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
  std::operator+(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"\" on line ",&local_2b1);
  string_trait_t::from_ascii(in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  lexical_analyzer_t<cfgfile::string_trait_t>::line_number
            ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,".",&local_319);
  string_trait_t::from_ascii(in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  exception_t<cfgfile::string_trait_t>::exception_t
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_31a = 0;
  __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}